

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall
duckdb::Executor::RescheduleTask(Executor *this,shared_ptr<duckdb::Task,_true> *task_p)

{
  mutex *__mutex;
  element_type *peVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  int iVar5;
  __node_base_ptr p_Var6;
  DatabaseInstance *this_00;
  TaskScheduler *this_01;
  type token;
  ulong uVar7;
  __node_base_ptr p_Var8;
  shared_ptr<duckdb::Task,_true> local_38;
  element_type *local_28;
  
  __mutex = &this->executor_lock;
  do {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar5 != 0) {
      ::std::__throw_system_error(iVar5);
    }
    if (this->cancelled != false) {
LAB_0054c3d4:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    peVar1 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar2 = (this->to_be_rescheduled_tasks)._M_h._M_bucket_count;
    uVar7 = (ulong)peVar1 % uVar2;
    p_Var3 = (this->to_be_rescheduled_tasks)._M_h._M_buckets[uVar7];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var3, p_Var8 = p_Var3->_M_nxt, peVar1 != (element_type *)p_Var3->_M_nxt[1]._M_nxt
       )) {
      while (p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar7) ||
           (p_Var6 = p_Var8, p_Var8 = p_Var4, peVar1 == (element_type *)p_Var4[1]._M_nxt))
        goto LAB_0054c330;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_0054c330:
    if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
      this_00 = DatabaseInstance::GetDatabase(this->context);
      this_01 = DatabaseInstance::GetScheduler(this_00);
      local_28 = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      ::std::
      _Hashtable<duckdb::Task_*,_std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Task_*>,_std::hash<duckdb::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->to_be_rescheduled_tasks)._M_h);
      token = unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::
              operator*(&this->producer);
      local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (task_p->internal).super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      TaskScheduler::ScheduleTask(this_01,token,&local_38);
      if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ::std::condition_variable::notify_one();
      goto LAB_0054c3d4;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

void Executor::RescheduleTask(shared_ptr<Task> &task_p) {
	// This function will spin lock until the task provided is added to the to_be_rescheduled_tasks
	while (true) {
		lock_guard<mutex> l(executor_lock);
		if (cancelled) {
			return;
		}
		auto entry = to_be_rescheduled_tasks.find(task_p.get());
		if (entry != to_be_rescheduled_tasks.end()) {
			auto &scheduler = TaskScheduler::GetScheduler(context);
			to_be_rescheduled_tasks.erase(task_p.get());
			scheduler.ScheduleTask(GetToken(), task_p);
			SignalTaskRescheduled(l);
			break;
		}
	}
}